

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::decoder_etc_block::get_block_colors5_bounds
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table,uint32_t l,
               uint32_t h)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  color32 *in_RDI;
  uint in_R8D;
  int *pInten_table;
  color32 b;
  char local_20;
  byte bStack_1f;
  byte bStack_1e;
  
  uVar1 = *in_RSI;
  local_20 = (char)uVar1;
  bVar2 = local_20 << 3 | (byte)((int)(uVar1 & 0xff) >> 2);
  bStack_1f = (byte)(uVar1 >> 8);
  bVar3 = bStack_1f << 3 | (byte)((int)(uint)bStack_1f >> 2);
  bStack_1e = (byte)(uVar1 >> 0x10);
  bVar4 = bStack_1e << 3 | (byte)((int)(uint)bStack_1e >> 2);
  uVar5 = clamp255((uint)bVar2 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_ECX * 4 + (ulong)in_EDX * 0x10));
  uVar6 = clamp255((uint)bVar3 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_ECX * 4 + (ulong)in_EDX * 0x10));
  uVar7 = clamp255((uint)bVar4 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_ECX * 4 + (ulong)in_EDX * 0x10));
  color32::set(in_RDI,uVar5,uVar6,uVar7,0xff);
  uVar5 = clamp255((uint)bVar2 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_R8D * 4 + (ulong)in_EDX * 0x10));
  uVar6 = clamp255((uint)bVar3 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_R8D * 4 + (ulong)in_EDX * 0x10));
  uVar7 = clamp255((uint)bVar4 +
                   *(int *)(g_etc1_inten_tables + (ulong)in_R8D * 4 + (ulong)in_EDX * 0x10));
  color32::set(in_RDI + 1,uVar5,uVar6,uVar7,0xff);
  return;
}

Assistant:

static void get_block_colors5_bounds(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table, uint32_t l = 0, uint32_t h = 3)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[l]), clamp255(b.g + pInten_table[l]), clamp255(b.b + pInten_table[l]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[h]), clamp255(b.g + pInten_table[h]), clamp255(b.b + pInten_table[h]), 255);
		}